

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O1

string * __thiscall
ExactFloat::ToStringWithMaxDigits_abi_cxx11_
          (string *__return_storage_ptr__,ExactFloat *this,int max_digits)

{
  uint uVar1;
  int i;
  int iVar2;
  int iVar3;
  char cVar4;
  string digits;
  char exp_buf [20];
  string local_68;
  char local_48 [24];
  
  if (0 < max_digits) {
    iVar2 = this->bn_exp_;
    if (iVar2 < 0x7ffffffd) {
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      uVar1 = GetDecimalDigits(this,max_digits,&local_68);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      cVar4 = (char)__return_storage_ptr__;
      if (this->sign_ < 0) {
        std::__cxx11::string::push_back(cVar4);
      }
      if ((int)uVar1 < -3 || max_digits < (int)uVar1) {
        std::__cxx11::string::push_back(cVar4);
        if (1 < local_68._M_string_length) {
          std::__cxx11::string::push_back(cVar4);
          std::__cxx11::string::replace
                    ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,
                     (char *)0x0,(ulong)(local_68._M_dataplus._M_p + 1));
        }
        sprintf(local_48,"e%+02d",(ulong)(uVar1 - 1));
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else if ((int)uVar1 < 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        if ((int)uVar1 < 0) {
          do {
            std::__cxx11::string::push_back(cVar4);
            uVar1 = uVar1 + 1;
          } while (uVar1 != 0);
        }
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
      }
      else if (uVar1 < local_68._M_string_length) {
        std::__cxx11::string::replace
                  ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,
                   (char *)0x0,(ulong)local_68._M_dataplus._M_p);
        std::__cxx11::string::push_back(cVar4);
        std::__cxx11::string::replace
                  ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,
                   (char *)0x0,(ulong)(local_68._M_dataplus._M_p + uVar1));
      }
      else {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
        if (0 < (int)(uVar1 - (int)local_68._M_string_length)) {
          iVar2 = (uVar1 - (int)local_68._M_string_length) + 1;
          do {
            std::__cxx11::string::push_back(cVar4);
            iVar2 = iVar2 + -1;
          } while (1 < iVar2);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    else {
      if (iVar2 == 0x7ffffffd) {
        iVar2 = this->sign_;
        iVar3 = 0x286b2c;
        if (iVar2 < 0) {
          iVar3 = 0x288e10;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        iVar2 = (iVar3 - (iVar2 >> 0x1f)) + 1;
      }
      else if (iVar2 == 0x7fffffff) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        iVar3 = 0x288e0c;
        iVar2 = 0x288e0f;
      }
      else {
        iVar2 = this->sign_;
        iVar3 = 0x288e14;
        if (iVar2 < 0) {
          iVar3 = 0x288e13;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        iVar2 = (iVar3 - (iVar2 >> 0x1f)) + 3;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,iVar3,iVar2);
    }
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
             ,0x172,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_68._M_string_length,"Check failed: (max_digits) > (0) ",0x21);
  abort();
}

Assistant:

string ExactFloat::ToStringWithMaxDigits(int max_digits) const {
  S2_DCHECK_GT(max_digits, 0);
  if (!is_normal()) {
    if (is_nan()) return "nan";
    if (is_zero()) return (sign_ < 0) ? "-0" : "0";
    return (sign_ < 0) ? "-inf" : "inf";
  }
  string digits;
  int exp10 = GetDecimalDigits(max_digits, &digits);
  string str;
  if (sign_ < 0) str.push_back('-');

  // We use the standard '%g' formatting rules.  If the exponent is less than
  // -4 or greater than or equal to the requested precision (i.e., max_digits)
  // then we use exponential notation.
  //
  // But since "exp10" is the base-10 exponent corresponding to a mantissa in
  // the range [0.1, 1), whereas the '%g' rules assume a mantissa in the range
  // [1.0, 10), we need to adjust these parameters by 1.
  if (exp10 <= -4 || exp10 > max_digits) {
    // Use exponential format.
    str.push_back(digits[0]);
    if (digits.size() > 1) {
      str.push_back('.');
      str.append(digits.begin() + 1, digits.end());
    }
    char exp_buf[20];
    sprintf(exp_buf, "e%+02d", exp10 - 1);
    str += exp_buf;
  } else {
    // Use fixed format.  We split this into two cases depending on whether
    // the integer portion is non-zero or not.
    if (exp10 > 0) {
      if (exp10 >= digits.size()) {
        str += digits;
        for (int i = exp10 - digits.size(); i > 0; --i) {
          str.push_back('0');
        }
      } else {
        str.append(digits.begin(), digits.begin() + exp10);
        str.push_back('.');
        str.append(digits.begin() + exp10, digits.end());
      }
    } else {
      str += "0.";
      for (int i = exp10; i < 0; ++i) {
        str.push_back('0');
      }
      str += digits;
    }
  }
  return str;
}